

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O2

Problem * preprocessProblem(Problem *prb)

{
  uint s;
  Property *unaff_R15;
  Options *unaff_retaddr;
  Preprocess prepro;
  
  s = (Lib::env->_randomSeed).super_OptionValue<unsigned_int>.actualValue;
  if (s == 0) {
    Lib::Random::resetSeed();
  }
  else {
    Lib::Random::setSeed(s);
  }
  if ((Lib::env->_mode).super_OptionValue<Shell::Options::Mode>.actualValue != SPIDER) {
    Kernel::Problem::getProperty(prb);
    Shell::Options::checkProblemOptionConstraints(unaff_retaddr,unaff_R15,false,false);
  }
  prepro._options = Lib::env;
  prepro._clausify = true;
  prepro._stillSimplify = false;
  Shell::Preprocess::preprocess(&prepro,prb);
  return prb;
}

Assistant:

[[nodiscard]]
Problem* preprocessProblem(Problem* prb)
{
  // Here officially starts preprocessing of vampireMode
  // and that's the moment we want to set the random seed (no randomness in parsing, for the peace of mind)
  // the main reason being that we want to stay in sync with what portfolio mode will do
  // cf ProvingHelper::runVampire
  if (env.options->randomSeed() != 0) {
    Lib::Random::setSeed(env.options->randomSeed());
  } else {
    Lib::Random::resetSeed();
  }

  TIME_TRACE(TimeTrace::PREPROCESSING);

  // this will provide warning if options don't make sense for problem
  if (env.options->mode()!=Options::Mode::SPIDER) {
    env.options->checkProblemOptionConstraints(prb->getProperty(), /*before_preprocessing = */ true);
  }

  Shell::Preprocess prepro(*env.options);
  //phases for preprocessing are being set inside the preprocess method
  prepro.preprocess(*prb);

  return prb;
}